

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  bool bVar1;
  TestCaseInfo *_name;
  size_type sVar2;
  pointer _string;
  reference pvVar3;
  char *pcVar4;
  ostream *poVar5;
  Colour local_61;
  undefined1 auStack_60 [7];
  Colour colourGuard_1;
  SourceLineInfo lineInfo;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  local_40;
  __normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  local_38;
  const_iterator itEnd;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  local_28;
  __normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  local_20;
  const_iterator it;
  Colour colourGuard;
  ConsoleReporter *this_local;
  
  bVar1 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::empty
                    (&(this->super_StreamingReporterBase).m_sectionStack);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_sectionStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/effolkronium[P]random/test/catch.hpp"
                  ,0x29f3,"void Catch::ConsoleReporter::printTestCaseAndSectionHeader()");
  }
  _name = Option<Catch::TestCaseInfo>::operator->
                    (&(this->super_StreamingReporterBase).currentTestCaseInfo.
                      super_Option<Catch::TestCaseInfo>);
  printOpenHeader(this,&_name->name);
  sVar2 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::size
                    (&(this->super_StreamingReporterBase).m_sectionStack);
  if (1 < sVar2) {
    Colour::Colour((Colour *)((long)&it._M_current + 7),Headers);
    itEnd._M_current =
         (SectionInfo *)
         std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::begin
                   (&(this->super_StreamingReporterBase).m_sectionStack);
    local_28 = __gnu_cxx::
               __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
               ::operator+((__normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                            *)&itEnd,1);
    __gnu_cxx::
    __normal_iterator<Catch::SectionInfo_const*,std::vector<Catch::SectionInfo,std::allocator<Catch::SectionInfo>>>
    ::__normal_iterator<Catch::SectionInfo*>
              ((__normal_iterator<Catch::SectionInfo_const*,std::vector<Catch::SectionInfo,std::allocator<Catch::SectionInfo>>>
                *)&local_20,&local_28);
    local_40._M_current =
         (SectionInfo *)
         std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::end
                   (&(this->super_StreamingReporterBase).m_sectionStack);
    __gnu_cxx::
    __normal_iterator<Catch::SectionInfo_const*,std::vector<Catch::SectionInfo,std::allocator<Catch::SectionInfo>>>
    ::__normal_iterator<Catch::SectionInfo*>
              ((__normal_iterator<Catch::SectionInfo_const*,std::vector<Catch::SectionInfo,std::allocator<Catch::SectionInfo>>>
                *)&local_38,&local_40);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&local_20,&local_38);
      if (!bVar1) break;
      _string = __gnu_cxx::
                __normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                ::operator->(&local_20);
      printHeaderString(this,&_string->name,2);
      __gnu_cxx::
      __normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
      ::operator++(&local_20);
    }
    Colour::~Colour((Colour *)((long)&it._M_current + 7));
  }
  pvVar3 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::back
                     (&(this->super_StreamingReporterBase).m_sectionStack);
  _auStack_60 = (pvVar3->lineInfo).file;
  bVar1 = SourceLineInfo::empty((SourceLineInfo *)auStack_60);
  if (!bVar1) {
    poVar5 = (this->super_StreamingReporterBase).stream;
    pcVar4 = getLineOfChars<(char)45>();
    poVar5 = std::operator<<(poVar5,pcVar4);
    std::operator<<(poVar5,'\n');
    Colour::Colour(&local_61,FileName);
    poVar5 = Catch::operator<<((this->super_StreamingReporterBase).stream,
                               (SourceLineInfo *)auStack_60);
    std::operator<<(poVar5,'\n');
    Colour::~Colour(&local_61);
  }
  poVar5 = (this->super_StreamingReporterBase).stream;
  pcVar4 = getLineOfChars<(char)46>();
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::operator<<(poVar5,'\n');
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printTestCaseAndSectionHeader() {
            assert( !m_sectionStack.empty() );
            printOpenHeader( currentTestCaseInfo->name );

            if( m_sectionStack.size() > 1 ) {
                Colour colourGuard( Colour::Headers );

                std::vector<SectionInfo>::const_iterator
                    it = m_sectionStack.begin()+1, // Skip first section (test case)
                    itEnd = m_sectionStack.end();
                for( ; it != itEnd; ++it )
                    printHeaderString( it->name, 2 );
            }

            SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

            if( !lineInfo.empty() ){
                stream << getLineOfChars<'-'>() << '\n';
                Colour colourGuard( Colour::FileName );
                stream << lineInfo << '\n';
            }
            stream << getLineOfChars<'.'>() << '\n' << std::endl;
        }